

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O2

void BMP_Free(BMP *bmp)

{
  if (bmp != (BMP *)0x0) {
    free(bmp->Palette);
    free(bmp->Data);
    free(bmp);
    BMP_LAST_ERROR_CODE = BMP_OK;
  }
  return;
}

Assistant:

void BMP_Free( BMP* bmp )
{
	if ( bmp == NULL )
	{
		return;
	}

	if ( bmp->Palette != NULL )
	{
		free( bmp->Palette );
	}

	if ( bmp->Data != NULL )
	{
		free( bmp->Data );
	}

	free( bmp );

	BMP_LAST_ERROR_CODE = BMP_OK;
}